

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  TypeID id;
  Variant *pVVar1;
  size_t sVar2;
  SPIRFunction *pSVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  BuiltIn BVar9;
  uint32_t uVar10;
  ExecutionModel EVar11;
  SPIRType *type;
  SPIRType *type_00;
  ulong uVar12;
  SPIRConstant *pSVar13;
  undefined7 extraout_var;
  CompilerError *this_00;
  uint *ts_1;
  ulong uVar14;
  StorageClass storage_00;
  SPIRVariable *pSVar15;
  uint32_t uVar16;
  ID IVar17;
  BuiltIn builtin;
  undefined4 local_254;
  uint local_250;
  uint32_t var_mbr_idx;
  undefined4 local_248;
  uint32_t location;
  string *local_240;
  SPIRType *local_238;
  uint32_t local_22c;
  InterfaceBlockMeta *local_228;
  undefined8 local_220;
  string var_name;
  uint32_t initializer;
  undefined4 uStack_1ec;
  _func_int *local_1e0 [2];
  uint32_t ptr_type_id;
  undefined4 uStack_1cc;
  uint local_1c0 [4];
  SPIRFunction *local_1b0;
  SPIRVariable *local_1a8;
  SmallVector<unsigned_int,_8UL> *local_1a0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_198;
  ParsedIR *local_190;
  SPIRType ptr_type;
  
  pSVar15 = var;
  local_240 = ib_var_ref;
  local_238 = ib_type;
  local_1b0 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if (meta->strip_array == true) {
    type = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    type = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar4 = Compiler::is_builtin_variable((Compiler *)this,var);
  BVar9 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  builtin = BVar9;
  bVar5 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (storage == StorageClassOutput) {
    bVar6 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar6) {
      emit_local_masked_variable(this,var,meta->strip_array);
      return;
    }
LAB_001c2ead:
    local_254 = 0;
  }
  else {
    if (storage != StorageClassInput) goto LAB_001c2ead;
    bVar6 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_254 = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar6) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"PerVertexKHR decoration is not supported in MSL.");
      goto LAB_001c39e6;
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  local_228 = meta;
  if (type->basetype != Struct) {
    EVar11 = Compiler::get_execution_model((Compiler *)this);
    if (((char)local_254 == '\x01' && EVar11 == ExecutionModelTessellationEvaluation) &&
       ((~meta->strip_array & bVar4 & BVar9 - BuiltInTessLevelOuter < 2) == 1)) {
      add_tess_level_input_to_interface_block(this,local_240,local_238,var);
      return;
    }
    if (Char < type->basetype) {
      return;
    }
    if ((0x8077fcU >> (type->basetype & (Image|Struct)) & 1) == 0) {
      return;
    }
    if ((bVar4) && (bVar5 = Compiler::has_active_builtin((Compiler *)this,BVar9,storage), !bVar5)) {
      return;
    }
    bVar5 = Compiler::is_matrix((Compiler *)this,type);
    if (bVar5) {
      bVar5 = false;
    }
    else {
      bVar5 = Compiler::is_array((Compiler *)this,type);
      bVar5 = !bVar5;
    }
    bVar6 = variable_storage_requires_stage_io(this,storage);
    bVar8 = true;
    if ((char)local_254 != '\0') {
      EVar11 = Compiler::get_execution_model((Compiler *)this);
      bVar8 = EVar11 == ExecutionModelFragment;
    }
    meta = local_228;
    if ((!bVar5 && bVar6) && (bVar4 & bVar8 & BVar9 - BuiltInVertexId < 0xfffffffe) == 0) {
      add_composite_variable_to_interface_block(this,storage,local_240,local_238,var,local_228);
      return;
    }
LAB_001c30b8:
    add_plain_variable_to_interface_block(this,storage,local_240,local_238,var,meta);
    return;
  }
  bVar6 = variable_storage_requires_stage_io(this,storage);
  if ((!bVar6) && (bVar5)) {
    bVar6 = (type->array).super_VectorView<unsigned_int>.buffer_size == 0;
  }
  bVar7 = 1;
  if ((!bVar4 && bVar6 == true) && (meta->allow_local_declaration == true)) {
    emit_local_masked_variable(this,var,meta->strip_array);
    bVar7 = 0;
  }
  if (bVar6 == false) goto LAB_001c30b8;
  location = 0xffffffff;
  var_mbr_idx = 0;
  bVar4 = Compiler::is_matrix((Compiler *)this,type);
  bVar6 = Compiler::is_array((Compiler *)this,type);
  if (bVar4) {
    if (bVar6) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_001c39e6:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar10 = type->columns;
  }
  else {
    if (!bVar6) {
      uVar10 = 1;
      goto LAB_001c313d;
    }
    if ((type->array).super_VectorView<unsigned_int>.buffer_size != 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"MSL cannot emit arrays-of-arrays in input and output variables.");
      goto LAB_001c39e6;
    }
    uVar10 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
  }
  if (uVar10 == 0) {
    return;
  }
LAB_001c313d:
  local_250 = 0;
  local_190 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_198 = &local_1b0->local_variables;
  local_1a0 = &this->vars_needing_early_declaration;
  uVar12 = (ulong)(uint)(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  uVar16 = 0;
  local_220 = 0;
  local_22c = uVar10;
  local_1a8 = var;
  do {
    if ((int)uVar12 != 0) {
      uVar14 = 0;
      do {
        builtin = BuiltInMax;
        uVar10 = (uint32_t)uVar14;
        bVar4 = Compiler::is_member_builtin((Compiler *)this,type,uVar10,&builtin);
        type_00 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar14].id);
        if ((storage == StorageClassOutput) &&
           (bVar6 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,uVar10,meta->strip_array), bVar6)) {
          location = 0xffffffff;
          local_220 = CONCAT71((int7)((ulong)local_220 >> 8),(byte)local_220 | bVar5);
          if ((bVar4) && (meta->strip_array == false)) {
            uVar10 = ParsedIR::increase_bound_by(local_190,2);
            ptr_type_id = uVar10;
            SPIRType::SPIRType(&ptr_type,type_00);
            ptr_type.pointer = true;
            ptr_type.pointer_depth = ptr_type.pointer_depth + 1;
            ptr_type.parent_type.id =
                 (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .ptr[uVar14].id;
            ptr_type.storage = StorageClassOutput;
            _initializer = _initializer & 0xffffffff00000000;
            uVar12 = (ulong)(var->initializer).id;
            if ((uVar12 != 0) &&
               ((uVar12 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.buffer_size &&
                (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr,
                pVVar1[uVar12].type == TypeConstant)))) {
              pSVar13 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar12);
              initializer = (pSVar13->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar14].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,&ptr_type);
            IVar17.id = uVar10 + 1;
            var_name._M_dataplus._M_p._0_4_ = 3;
            pSVar15 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,IVar17.id,&ptr_type_id,(StorageClass *)&var_name,
                       (uint *)pSVar15);
            pSVar3 = local_1b0;
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                      (local_198,
                       (local_1b0->local_variables).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size +
                       1);
            sVar2 = (pSVar3->local_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            (pSVar3->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .ptr[sVar2].id = IVar17.id;
            (pSVar3->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size = sVar2 + 1;
            SmallVector<unsigned_int,_8UL>::reserve
                      (local_1a0,
                       (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                    buffer_size;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] =
                 IVar17.id;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                 sVar2 + 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&var_name,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,IVar17,&var_name);
            var = local_1a8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
                &var_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(var_name._M_dataplus._M_p._4_4_,
                                       var_name._M_dataplus._M_p._0_4_));
            }
            Compiler::set_decoration((Compiler *)this,IVar17,DecorationBuiltIn,builtin);
            ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003a2fa8;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&ptr_type.member_name_cache._M_h);
            ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &ptr_type.member_type_index_redirection.stack_storage) {
              free(ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            ptr_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                ptr_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                .ptr != &ptr_type.member_types.stack_storage) {
              free(ptr_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            ptr_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)ptr_type.array_size_literal.super_VectorView<bool>.ptr
                != &ptr_type.array_size_literal.stack_storage) {
              free(ptr_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            ptr_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                ptr_type.array.super_VectorView<unsigned_int>.ptr != &ptr_type.array.stack_storage)
            {
              free(ptr_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
        }
        else if ((!bVar4) ||
                (bVar6 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar6)) {
          bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
          if ((bVar6) || (bVar6 = Compiler::is_array((Compiler *)this,type_00), bVar6)) {
            local_248 = 0;
          }
          else {
            local_248 = (undefined4)CONCAT71(extraout_var,type_00->basetype != Struct);
          }
          bVar6 = true;
          storage_00 = storage;
          if ((char)local_254 != '\0') {
            EVar11 = Compiler::get_execution_model((Compiler *)this);
            bVar6 = EVar11 == ExecutionModelFragment;
            storage_00 = StorageClassInput;
          }
          bVar8 = variable_storage_requires_stage_io(this,storage_00);
          BVar9 = builtin;
          ts_1 = (uint *)&DAT_00000001;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&var_name,this,(ulong)(var->super_IVariant).self.id);
          _ptr_type_id = (pointer)local_1c0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&ptr_type_id,
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                     var_name._M_string_length +
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
          _initializer = (pointer)local_1e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&initializer,
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                     var_name._M_string_length +
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
          if (local_22c != 1) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&ptr_type,(spirv_cross *)0x2efe70,(char (*) [2])&local_250,ts_1);
            ::std::__cxx11::string::_M_append
                      ((char *)&ptr_type_id,(ulong)ptr_type.super_IVariant._vptr_IVariant);
            if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.basetype) {
              operator_delete(ptr_type.super_IVariant._vptr_IVariant);
            }
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&ptr_type,(spirv_cross *)0x2e4336,(char (*) [2])&local_250,
                       (uint *)0x2ef80f,(char (*) [2])pSVar15);
            ::std::__cxx11::string::_M_append
                      ((char *)&initializer,(ulong)ptr_type.super_IVariant._vptr_IVariant);
            if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.basetype) {
              operator_delete(ptr_type.super_IVariant._vptr_IVariant);
            }
          }
          meta = local_228;
          pSVar15 = var;
          if (((~bVar8 | (byte)local_248) & 1) == 0 &&
              (bVar4 & bVar6 & BVar9 - BuiltInVertexId < 0xfffffffe) == 0) {
            ptr_type.super_IVariant._vptr_IVariant = (_func_int **)0x0;
            ptr_type.super_IVariant._8_8_ = &ptr_type.array.stack_storage;
            ptr_type.basetype = Void;
            ptr_type.width = 0;
            ptr_type.vecsize = 0;
            ptr_type.columns = 0;
            ptr_type.array.super_VectorView<unsigned_int>.ptr = (uint *)0x0;
            ptr_type.array.super_VectorView<unsigned_int>.buffer_size = 0x3f800000;
            ptr_type.array.buffer_capacity = 0;
            ptr_type.array.stack_storage.aligned_char[0] = '\0';
            ptr_type.array.stack_storage.aligned_char[1] = '\0';
            ptr_type.array.stack_storage.aligned_char[2] = '\0';
            ptr_type.array.stack_storage.aligned_char[3] = '\0';
            ptr_type.array.stack_storage.aligned_char[4] = '\0';
            ptr_type.array.stack_storage.aligned_char[5] = '\0';
            ptr_type.array.stack_storage.aligned_char[6] = '\0';
            ptr_type.array.stack_storage.aligned_char[7] = '\0';
            add_composite_member_variable_to_interface_block
                      (this,storage,local_240,local_238,var,type,uVar10,local_228,
                       (string *)&ptr_type_id,(string *)&initializer,&location,&var_mbr_idx,
                       (Bitset *)&ptr_type);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&ptr_type.super_IVariant.self);
          }
          else {
            add_plain_member_variable_to_interface_block
                      (this,storage,local_240,local_238,var,type,uVar10,local_228,
                       (string *)&ptr_type_id,(string *)&initializer,&location,&var_mbr_idx);
          }
          if ((_func_int **)_initializer != local_1e0) {
            operator_delete(_initializer);
          }
          if ((uint *)_ptr_type_id != local_1c0) {
            operator_delete(_ptr_type_id);
          }
          uVar16 = var_mbr_idx;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
              &var_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_
                                    ));
            uVar16 = var_mbr_idx;
          }
        }
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 + 1;
        uVar12 = (ulong)(uint)(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                              buffer_size;
        uVar10 = local_22c;
        var_mbr_idx = uVar16;
      } while (uVar14 < uVar12);
    }
    local_250 = local_250 + 1;
  } while (local_250 < uVar10);
  if (((bVar7 & (byte)local_220) != 0) &&
     ((bVar4 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar4 ||
      (EVar11 = Compiler::get_execution_model((Compiler *)this),
      EVar11 == ExecutionModelTessellationControl)))) {
    bVar4 = Compiler::is_builtin_variable((Compiler *)this,var);
    if (bVar4) {
      if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size != 0) {
        uVar10 = 0;
        do {
          id.id = (type->super_IVariant).self.id;
          uVar16 = Compiler::get_member_decoration((Compiler *)this,id,uVar10,DecorationBuiltIn);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    (&ptr_type,this,(ulong)uVar16,3);
          Compiler::set_member_name((Compiler *)this,id,uVar10,(string *)&ptr_type);
          if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.basetype) {
            operator_delete(ptr_type.super_IVariant._vptr_IVariant);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uint)(type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size);
      }
      IVar17.id = (type->super_IVariant).self.id;
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.basetype;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_PerVertex","");
      Compiler::set_name((Compiler *)this,IVar17,(string *)&ptr_type);
      if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.basetype) {
        operator_delete(ptr_type.super_IVariant._vptr_IVariant);
      }
      IVar17.id = (var->super_IVariant).self.id;
      ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.basetype;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_out_masked","");
      Compiler::set_name((Compiler *)this,IVar17,(string *)&ptr_type);
      if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.basetype) {
        operator_delete(ptr_type.super_IVariant._vptr_IVariant);
      }
      (this->stage_out_masked_builtin_type_id).id = (type->super_IVariant).self.id;
    }
    emit_local_masked_variable(this,var,meta->strip_array);
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}